

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O3

void __thiscall flow::lang::IRGenerator::codegenInline(IRGenerator *this,HandlerSym *handlerSym)

{
  Report *pRVar1;
  pointer pcVar2;
  SymbolTable *pSVar3;
  pointer puVar4;
  __uniq_ptr_data<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>,_true,_true> _Var5;
  Stmt *pSVar6;
  unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> *symbol;
  pointer puVar7;
  _Deque_iterator<flow::lang::HandlerSym_*,_flow::lang::HandlerSym_*&,_flow::lang::HandlerSym_**> i;
  string local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  HandlerSym *local_80;
  _Elt_pointer local_78;
  _Elt_pointer ppHStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50 [2];
  
  local_e8._M_dataplus._M_p =
       (pointer)(this->handlerStack_).
                super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_e8._M_string_length =
       (size_type)
       (this->handlerStack_).
       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_first;
  local_e8.field_2._M_allocated_capacity =
       (size_type)
       (this->handlerStack_).
       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_last;
  local_e8.field_2._8_8_ =
       (this->handlerStack_).
       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_node;
  local_78 = (this->handlerStack_).
             super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppHStack_70 = (this->handlerStack_).
                super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_68 = *(undefined4 *)
              &(this->handlerStack_).
               super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_last;
  uStack_64 = *(undefined4 *)
               ((long)&(this->handlerStack_).
                       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_last + 4);
  uStack_60 = *(undefined4 *)
               &(this->handlerStack_).
                super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
  uStack_5c = *(undefined4 *)
               ((long)&(this->handlerStack_).
                       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
  local_80 = handlerSym;
  std::
  __find_if<std::_Deque_iterator<flow::lang::HandlerSym*,flow::lang::HandlerSym*&,flow::lang::HandlerSym**>,__gnu_cxx::__ops::_Iter_equals_val<flow::lang::HandlerSym*const>>
            (local_50);
  if ((_Elt_pointer)local_50[0]._0_8_ !=
      (this->handlerStack_).
      super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>._M_impl
      .super__Deque_impl_data._M_finish._M_cur) {
    pRVar1 = this->report_;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Cannot recursively call handler {}.","");
    pcVar2 = (handlerSym->super_CallableSym).super_Symbol.name_._M_dataplus._M_p;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar2,
               pcVar2 + (handlerSym->super_CallableSym).super_Symbol.name_._M_string_length);
    diagnostics::Report::typeError<std::__cxx11::string>
              (pRVar1,&(handlerSym->super_CallableSym).super_Symbol.super_ASTNode.location_,
               &local_e8,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
      return;
    }
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    return;
  }
  local_e8._M_dataplus._M_p = (pointer)handlerSym;
  std::deque<flow::lang::HandlerSym*,std::allocator<flow::lang::HandlerSym*>>::
  emplace_back<flow::lang::HandlerSym*>
            ((deque<flow::lang::HandlerSym*,std::allocator<flow::lang::HandlerSym*>> *)
             &this->handlerStack_,(HandlerSym **)&local_e8);
  pSVar3 = (handlerSym->scope_)._M_t.
           super___uniq_ptr_impl<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_>
           ._M_t.
           super__Tuple_impl<0UL,_flow::lang::SymbolTable_*,_std::default_delete<flow::lang::SymbolTable>_>
           .super__Head_base<0UL,_flow::lang::SymbolTable_*,_false>._M_head_impl;
  if (pSVar3 != (SymbolTable *)0x0) {
    puVar4 = (pSVar3->symbols_).
             super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar7 = *(pointer *)
                   &(pSVar3->symbols_).
                    super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
        ; puVar7 != puVar4; puVar7 = puVar7 + 1) {
      _Var5.super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>._M_t
      .super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>.
      super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl =
           (puVar7->_M_t).
           super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>;
      (**(code **)(*(long *)_Var5.
                            super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>
                            .super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl + 0x10)
      )(_Var5.super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>.
        _M_t.super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>.
        super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl,this);
    }
  }
  pSVar6 = (handlerSym->body_)._M_t.
           super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
           super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
  if (pSVar6 == (Stmt *)0x0) {
    pRVar1 = this->report_;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Forward declared handler \'{}\' is missing implementation.","");
    pcVar2 = (handlerSym->super_CallableSym).super_Symbol.name_._M_dataplus._M_p;
    local_c0._M_allocated_capacity = (size_type)&local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar2,
               pcVar2 + (handlerSym->super_CallableSym).super_Symbol.name_._M_string_length);
    diagnostics::Report::typeError<std::__cxx11::string>
              (pRVar1,&(handlerSym->super_CallableSym).super_Symbol.super_ASTNode.location_,
               &local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_allocated_capacity != &local_b0) {
      operator_delete((void *)local_c0._M_allocated_capacity,local_b0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    pSVar6 = (handlerSym->body_)._M_t.
             super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
             super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
    if (pSVar6 == (Stmt *)0x0) {
      this->result_ = (Value *)0x0;
      goto LAB_00124165;
    }
  }
  (*(pSVar6->super_ASTNode)._vptr_ASTNode[2])(pSVar6,this);
LAB_00124165:
  std::deque<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>::pop_back
            (&this->handlerStack_);
  return;
}

Assistant:

void IRGenerator::codegenInline(HandlerSym& handlerSym) {
  auto i = std::find(handlerStack_.begin(), handlerStack_.end(), &handlerSym);
  if (i != handlerStack_.end()) {
    report_->typeError(handlerSym.location(),
                       "Cannot recursively call handler {}.", handlerSym.name());

    return;
  }

  handlerStack_.push_back(&handlerSym);

  // emit local variable declarations
  if (handlerSym.scope()) {
    for (std::unique_ptr<Symbol>& symbol : *handlerSym.scope()) {
      codegen(symbol.get());
    }
  }

  if (handlerSym.body() == nullptr) {
    report_->typeError(handlerSym.location(),
                       "Forward declared handler '{}' is missing implementation.",
                       handlerSym.name());
  }

  // emit body
  codegen(handlerSym.body());

  handlerStack_.pop_back();
}